

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

TidyOption tidyOptGetNextDocLinks(TidyDoc tdoc,TidyIterator *pos)

{
  TidyIterator p_Var1;
  TidyOptionImpl *pTVar2;
  TidyIterator p_Var3;
  
  p_Var1 = *pos;
  if (p_Var1->_opaque == TidyUnknownOption) {
    pTVar2 = (TidyOptionImpl *)0x0;
    p_Var3 = (TidyIterator)0x0;
  }
  else {
    pTVar2 = prvTidygetOption(p_Var1->_opaque);
    p_Var3 = (TidyIterator)0x0;
    if (p_Var1[1]._opaque != 0) {
      p_Var3 = p_Var1 + 1;
    }
  }
  *pos = p_Var3;
  return (TidyOption)pTVar2;
}

Assistant:

TidyOption TIDY_CALL tidyOptGetNextDocLinks( TidyDoc tdoc, TidyIterator* pos )
{
    const TidyOptionId* curr = (const TidyOptionId *)*pos;
    TidyOption opt;

    if (*curr == TidyUnknownOption)
    {
        *pos = (TidyIterator)NULL;
        return (TidyOption)0;
    }
    opt = tidyGetOption(tdoc, *curr);
    curr++;
    *pos = (*curr == TidyUnknownOption ) ?
        (TidyIterator)NULL:(TidyIterator)curr;
    return opt;
}